

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O2

void __thiscall serialize_tests::with_params_multi::test_method(with_params_multi *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  string *psVar2;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  Base base2;
  char *local_100;
  char *local_f8;
  OtherParam *local_f0;
  OtherParamChecker *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  Base base1;
  ParamsStream<ParamsStream<ParamsStream<DataStream_&,_serialize_tests::OtherParam>,_serialize_tests::OtherParam>,_serialize_tests::BaseFormat>
  pstream;
  DataStream stream;
  OtherParamChecker check;
  OtherParam other_param_override;
  OtherParam other_param_ignored;
  OtherParam other_param_used;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pstream.m_substream.m_params = &other_param_used;
  other_param_used.param = '\x10';
  pstream.m_substream.m_substream.m_params = &other_param_ignored;
  other_param_ignored.param = '\x11';
  other_param_override.param = '\x12';
  pstream.m_substream.m_substream.m_substream = &stream;
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  stream.m_read_pos = 0;
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pstream.m_params = (BaseFormat *)&RAW;
  base1.m_base_data = ' ';
  Base::
  Serialize<ParamsStream<ParamsStream<ParamsStream<DataStream&,serialize_tests::OtherParam>,serialize_tests::OtherParam>,serialize_tests::BaseFormat>>
            (&base1,&pstream);
  OtherParamChecker::
  Serialize<ParamsStream<ParamsStream<ParamsStream<DataStream&,serialize_tests::OtherParam>,serialize_tests::OtherParam>,serialize_tests::BaseFormat>>
            (&check,&pstream);
  local_f0 = &other_param_override;
  local_e8 = &check;
  ParamsWrapper<serialize_tests::OtherParam,serialize_tests::OtherParamChecker_const>::
  Serialize<ParamsStream<ParamsStream<ParamsStream<DataStream&,serialize_tests::OtherParam>,serialize_tests::OtherParam>,serialize_tests::BaseFormat>>
            ((ParamsWrapper<serialize_tests::OtherParam,serialize_tests::OtherParamChecker_const> *)
             &local_f0,&pstream);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x195;
  file.m_begin = (iterator)&local_c0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d0,msg);
  local_e8 = (OtherParamChecker *)((ulong)local_e8 & 0xffffffffffffff00);
  local_f0 = (OtherParam *)&PTR__lazy_ostream_011480b0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_f8 = "";
  DataStream::str_abi_cxx11_(&local_58,&stream);
  pvVar1 = (iterator)0x2;
  psVar2 = &local_58;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[4]>
            (&local_f0,&local_100,0x195,1,2,psVar2,"stream.str()"," \x10\x12","\"\\x20\\x10\\x12\"")
  ;
  std::__cxx11::string::~string((string *)&local_58);
  base2.m_base_data = '\x11';
  Base::
  Unserialize<ParamsStream<ParamsStream<ParamsStream<DataStream&,serialize_tests::OtherParam>,serialize_tests::OtherParam>,serialize_tests::BaseFormat>>
            (&base2,&pstream);
  OtherParamChecker::
  Unserialize<ParamsStream<ParamsStream<ParamsStream<DataStream&,serialize_tests::OtherParam>,serialize_tests::OtherParam>,serialize_tests::BaseFormat>>
            (&check,&pstream);
  local_f0 = &other_param_override;
  local_e8 = &check;
  ParamsWrapper<serialize_tests::OtherParam,serialize_tests::OtherParamChecker_const>::
  Unserialize<ParamsStream<ParamsStream<ParamsStream<DataStream&,serialize_tests::OtherParam>,serialize_tests::OtherParam>,serialize_tests::BaseFormat>>
            ((ParamsWrapper<serialize_tests::OtherParam,serialize_tests::OtherParamChecker_const> *)
             &local_f0,&pstream);
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x199;
  file_00.m_begin = (iterator)&local_118;
  msg_00.m_end = (iterator)psVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_128,
             msg_00);
  local_e8 = (OtherParamChecker *)((ulong)local_e8 & 0xffffffffffffff00);
  local_f0 = (OtherParam *)&PTR__lazy_ostream_011480b0;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_130 = "";
  local_58._M_dataplus._M_p._0_4_ = 0x20;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (&local_f0,&local_138,0x199,1,2,&base2,"base2.m_base_data",&local_58,"0x20");
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&stream);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(with_params_multi)
{
    const OtherParam other_param_used{.param = 0x10};
    const OtherParam other_param_ignored{.param = 0x11};
    const OtherParam other_param_override{.param = 0x12};
    const OtherParamChecker check;
    DataStream stream;
    ParamsStream pstream{stream, RAW, other_param_used, other_param_ignored};

    Base base1{0x20};
    pstream << base1 << check << other_param_override(check);
    BOOST_CHECK_EQUAL(stream.str(), "\x20\x10\x12");

    Base base2;
    pstream >> base2 >> check >> other_param_override(check);
    BOOST_CHECK_EQUAL(base2.m_base_data, 0x20);
}